

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O1

ExprBase * AnalyzeDereference(ExpressionContext *ctx,SynDereference *syntax)

{
  TypeStruct *pTVar1;
  int iVar2;
  ExprBase *pEVar3;
  _func_int **pp_Var4;
  undefined4 extraout_var;
  ExprBase *pEVar5;
  undefined **ppuVar6;
  undefined4 extraout_var_01;
  TypeBase *pTVar7;
  ulong uVar8;
  char *msg;
  ExprBase *unaff_R12;
  TypeBase *pTVar9;
  undefined4 extraout_var_00;
  
  pEVar3 = AnalyzeExpression(ctx,syntax->value);
  pTVar7 = pEVar3->type;
  if (pTVar7 == (TypeBase *)0x0) {
LAB_0017109d:
    pTVar9 = (TypeBase *)0x0;
  }
  else {
    if (pTVar7->typeID == 0) {
      iVar2 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x38);
      pEVar5 = (ExprBase *)CONCAT44(extraout_var_01,iVar2);
      pTVar7 = &ExpressionContext::GetErrorType(ctx)->super_TypeBase;
      pEVar5->typeID = 0x16;
      pEVar5->source = &syntax->super_SynBase;
      pEVar5->type = pTVar7;
      pEVar5->next = (ExprBase *)0x0;
      pEVar5->listed = false;
      ppuVar6 = &PTR__ExprBase_00248a80;
      goto LAB_001711e9;
    }
    if ((pTVar7 == (TypeBase *)0x0) || (pTVar9 = pTVar7, pTVar7->typeID != 0x12)) goto LAB_0017109d;
  }
  if (pTVar9 != (TypeBase *)0x0) {
    if ((pTVar9[1]._vptr_TypeBase != (_func_int **)0x0) &&
       (*(int *)(pTVar9[1]._vptr_TypeBase + 1) == 1)) {
      uVar8 = (ulong)(uint)(*(int *)&(pTVar7->name).end - (int)(pTVar7->name).begin);
      msg = "ERROR: cannot dereference type \'%.*s\'";
      goto LAB_00171236;
    }
    pp_Var4 = pTVar9[1]._vptr_TypeBase;
    if ((pp_Var4 == (_func_int **)0x0) || (*(int *)(pp_Var4 + 1) != 0x18)) {
      pp_Var4 = (_func_int **)0x0;
    }
    if ((pp_Var4 != (_func_int **)0x0) && (*(char *)(pp_Var4 + 0x24) == '\0')) {
      uVar8 = (ulong)(uint)(*(int *)(pp_Var4 + 3) - (int)pp_Var4[2]);
      msg = "ERROR: type \'%.*s\' is not fully defined";
      goto LAB_00171236;
    }
    iVar2 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x38);
    unaff_R12 = (ExprBase *)CONCAT44(extraout_var,iVar2);
    pTVar7 = (TypeBase *)pTVar9[1]._vptr_TypeBase;
    unaff_R12->typeID = 0x16;
    unaff_R12->source = &syntax->super_SynBase;
    unaff_R12->type = pTVar7;
    unaff_R12->next = (ExprBase *)0x0;
    unaff_R12->listed = false;
    unaff_R12->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_00248a80;
    unaff_R12[1]._vptr_ExprBase = (_func_int **)pEVar3;
  }
  if (pTVar9 != (TypeBase *)0x0) {
    return unaff_R12;
  }
  pTVar7 = pEVar3->type;
  if ((pTVar7 != (TypeBase *)0x0) && (pTVar7->typeID == 0x10)) {
    if ((pEVar3 != (ExprBase *)0x0) && (pEVar3->typeID == 0x17)) {
      anon_unknown.dwarf_c6b42::Stop
                (ctx,&syntax->super_SynBase,"ERROR: cannot dereference value of unknown type");
    }
    iVar2 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x38);
    pEVar5 = (ExprBase *)CONCAT44(extraout_var_00,iVar2);
    pTVar1 = ctx->typeAutoRef;
    pEVar5->typeID = 0x17;
    pEVar5->source = &syntax->super_SynBase;
    pEVar5->type = &pTVar1->super_TypeBase;
    pEVar5->next = (ExprBase *)0x0;
    pEVar5->listed = false;
    ppuVar6 = &PTR__ExprBase_00248d58;
LAB_001711e9:
    pEVar5->_vptr_ExprBase = (_func_int **)ppuVar6;
    pEVar5[1]._vptr_ExprBase = (_func_int **)pEVar3;
    return pEVar5;
  }
  uVar8 = (ulong)(uint)(*(int *)&(pTVar7->name).end - (int)(pTVar7->name).begin);
  msg = "ERROR: cannot dereference type \'%.*s\' that is not a pointer";
LAB_00171236:
  anon_unknown.dwarf_c6b42::Stop(ctx,&syntax->super_SynBase,msg,uVar8);
}

Assistant:

ExprBase* AnalyzeDereference(ExpressionContext &ctx, SynDereference *syntax)
{
	ExprBase *value = AnalyzeExpression(ctx, syntax->value);

	if(isType<TypeError>(value->type))
		return new (ctx.get<ExprDereference>()) ExprDereference(syntax, ctx.GetErrorType(), value);

	if(TypeRef *type = getType<TypeRef>(value->type))
	{
		if(isType<TypeVoid>(type->subType))
			Stop(ctx, syntax, "ERROR: cannot dereference type '%.*s'", FMT_ISTR(value->type->name));

		if(TypeClass *typeClass = getType<TypeClass>(type->subType))
		{
			if(!typeClass->completed)
				Stop(ctx, syntax, "ERROR: type '%.*s' is not fully defined", FMT_ISTR(typeClass->name));
		}

		return new (ctx.get<ExprDereference>()) ExprDereference(syntax, type->subType, value);
	}

	if(isType<TypeAutoRef>(value->type))
	{
		if(isType<ExprUnboxing>(value))
			Stop(ctx, syntax, "ERROR: cannot dereference value of unknown type");

		return new (ctx.get<ExprUnboxing>()) ExprUnboxing(syntax, ctx.typeAutoRef, value);
	}

	Stop(ctx, syntax, "ERROR: cannot dereference type '%.*s' that is not a pointer", FMT_ISTR(value->type->name));

	return NULL;
}